

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluGLUtil.cpp
# Opt level: O1

EGLConfig eglu::chooseConfig(Library *egl,EGLDisplay display,RenderConfig *config)

{
  SurfaceType SVar1;
  void *pvVar2;
  uint uVar3;
  deUint32 dVar4;
  NotSupportedError *this;
  pointer *__return_storage_ptr__;
  ulong uVar5;
  pointer ppvVar6;
  bool bVar7;
  byte bVar8;
  EGLint renderableType;
  vector<void_*,_std::allocator<void_*>_> configs;
  uint local_68;
  byte local_61;
  EGLDisplay local_60;
  void *local_58;
  pointer local_50;
  pointer local_48;
  pointer local_40;
  long local_38;
  
  __return_storage_ptr__ = &local_48;
  local_60 = display;
  getConfigs((vector<void_*,_std::allocator<void_*>_> *)__return_storage_ptr__,egl,display);
  bVar8 = local_48 == local_40;
  ppvVar6 = local_48;
  do {
    if ((bool)bVar8) {
LAB_001779da:
      if ((bVar8 & 1) == 0) {
        if (local_48 != (pointer)0x0) {
          operator_delete(local_48,local_38 - (long)local_48);
        }
        return __return_storage_ptr__;
      }
      this = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this,"Matching EGL config not found",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                 ,0x108);
      __cxa_throw(this,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    pvVar2 = *ppvVar6;
    local_68 = 0;
    uVar3 = apiRenderableType((ApiType)((config->type).super_ApiType.m_bits & 0x3ff));
    __return_storage_ptr__ = (pointer *)(ulong)uVar3;
    local_58 = pvVar2;
    (*egl->_vptr_Library[0x19])(egl,local_60,pvVar2,0x3040,&local_68);
    dVar4 = (*egl->_vptr_Library[0x1f])(egl);
    checkError(dVar4,"getConfigAttrib(display, eglConfig, EGL_RENDERABLE_TYPE, &renderableType)",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
               ,0xc4);
    if ((local_68 & uVar3) != 0) {
      SVar1 = config->surfaceType;
      if ((long)(int)SVar1 != 0) {
        local_68 = 0;
        uVar3 = 0;
        if (SVar1 < SURFACETYPE_LAST) {
          uVar3 = *(uint *)(&DAT_00225e9c + (long)(int)SVar1 * 4);
        }
        (*egl->_vptr_Library[0x19])(egl,local_60,local_58,0x3033,&local_68);
        dVar4 = (*egl->_vptr_Library[0x1f])(egl);
        checkError(dVar4,"getConfigAttrib(display, eglConfig, EGL_SURFACE_TYPE, &surfaceType)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                   ,0xd8);
        if ((local_68 & uVar3) == 0) goto LAB_001779c0;
      }
      uVar5 = 0;
      __return_storage_ptr__ = (pointer *)&DAT_00225df8;
      bVar7 = false;
      local_61 = bVar8;
      local_50 = ppvVar6;
      do {
        ppvVar6 = __return_storage_ptr__[-1];
        if (*(int *)((long)&(config->type).super_ApiType.m_bits + (long)ppvVar6) != -1) {
          local_68 = 0;
          (*egl->_vptr_Library[0x19])
                    (egl,local_60,local_58,(ulong)*(uint *)__return_storage_ptr__,&local_68);
          dVar4 = (*egl->_vptr_Library[0x1f])(egl);
          checkError(dVar4,
                     "getConfigAttrib(display, eglConfig, s_attribs[attribNdx].attrib, &value)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluGLUtil.cpp"
                     ,0xf4);
          if (local_68 != *(uint *)((long)&(config->type).super_ApiType.m_bits + (long)ppvVar6))
          break;
        }
        bVar7 = 6 < uVar5;
        uVar5 = uVar5 + 1;
        __return_storage_ptr__ = __return_storage_ptr__ + 2;
      } while (uVar5 != 8);
      ppvVar6 = local_50;
      if (bVar7) {
        __return_storage_ptr__ = (pointer *)*local_50;
        bVar8 = local_61;
        goto LAB_001779da;
      }
    }
LAB_001779c0:
    ppvVar6 = ppvVar6 + 1;
    bVar8 = ppvVar6 == local_40;
  } while( true );
}

Assistant:

EGLConfig chooseConfig (const Library& egl, EGLDisplay display, const glu::RenderConfig& config)
{
	const std::vector<EGLConfig> configs = eglu::getConfigs(egl, display);

	for (vector<EGLConfig>::const_iterator iter = configs.begin(); iter != configs.end(); ++iter)
	{
		if (configMatches(egl, display, *iter, config))
			return *iter;
	}

	throw tcu::NotSupportedError("Matching EGL config not found", DE_NULL, __FILE__, __LINE__);
}